

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

Image * __thiscall
Image::transformLinear(Image *__return_storage_ptr__,Image *this,int s_min,int s_max)

{
  int iVar1;
  int **ppiVar2;
  long lVar3;
  int i;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  undefined8 uStack_50;
  undefined1 local_48 [8];
  Image result;
  
  if ((s_max | s_min) < 0) {
    s_min = this->maxGray;
    uVar7 = 0;
    uVar6 = (ulong)(uint)this->col;
    if (this->col < 1) {
      uVar6 = uVar7;
    }
    uVar4 = (ulong)(uint)this->row;
    if (this->row < 1) {
      uVar4 = uVar7;
    }
    s_max = 0;
    for (; uVar7 != uVar4; uVar7 = uVar7 + 1) {
      for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
        iVar1 = this->matrix[uVar7][uVar9];
        if (s_max < iVar1) {
          s_max = iVar1;
        }
        if (iVar1 < s_min) {
          s_min = iVar1;
        }
      }
    }
  }
  uStack_50 = 0x103019;
  Image((Image *)local_48,this);
  lVar3 = -((ulong)(this->maxGray + 1) * 4 + 0xf & 0xfffffffffffffff0);
  iVar1 = this->maxGray;
  iVar5 = -(iVar1 * s_min);
  for (lVar10 = 0; lVar10 <= iVar1; lVar10 = lVar10 + 1) {
    *(int *)(local_48 + lVar10 * 4 + lVar3 + -0x48 + 0x48) = iVar5 / (s_max - s_min);
    iVar5 = iVar5 + iVar1;
  }
  for (lVar10 = 0; lVar10 < this->row; lVar10 = lVar10 + 1) {
    ppiVar2 = this->matrix;
    for (lVar8 = 0; lVar8 < this->col; lVar8 = lVar8 + 1) {
      *(undefined4 *)(*(long *)(result._8_8_ + lVar10 * 8) + lVar8 * 4) =
           *(undefined4 *)(local_48 + (long)ppiVar2[lVar10][lVar8] * 4 + lVar3 + -0x48 + 0x48);
    }
  }
  *(undefined8 *)(local_48 + lVar3 + -8) = 0x1030a6;
  normalize((Image *)local_48);
  *(undefined8 *)(local_48 + lVar3 + -8) = 0x1030b1;
  Image(__return_storage_ptr__,(Image *)local_48);
  uStack_50 = 0x1030bd;
  ~Image((Image *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Image Image::transformLinear(int s_min, int s_max)
{
    if(s_min < 0 || s_max < 0)
    {
        s_min=maxGray, s_max=0;
        for (int i = 0; i < row; ++i) {
            for (int j = 0; j < col; ++j) {
                if(matrix[i][j] > s_max)
                    s_max = matrix[i][j];
                if(matrix[i][j] < s_min)
                    s_min = matrix[i][j];
            }
        }
    }

    Image result = clone();
    int LUT[maxGray+1];

    for(int i=0; i<=maxGray; ++i)
    {
        LUT[i] = maxGray*(i - s_min)/(s_max - s_min);
    }

    for (int i = 0; i < row; ++i) {
        for (int j = 0; j < col; ++j) {
            result.matrix[i][j] = LUT[matrix[i][j]];
        }
    }

    return result.normalize();
}